

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::make(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  ostream *poVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  uint32_t uVar5;
  Type type_00;
  Expression *pEVar6;
  undefined1 local_1b0 [399];
  char local_21;
  
  type_00 = getSubType(this,type);
  if (this->trivialNesting == 0) {
    this_00 = &this->random;
    if ((this->random).finishedInput == false) {
      iVar2 = this->nesting;
      iVar3 = (this->fuzzParams->super_FuzzParams).NESTING_LIMIT;
      if (SBORROW4(iVar2,iVar3 * 5) != iVar2 + iVar3 * -5 < 0) {
        if (iVar2 < iVar3) {
LAB_001297d6:
          this->nesting = this->nesting + 1;
          if (type_00.id < 2) {
            if ((type_00.id & 1) == 0) {
              pEVar6 = _makenone(this);
            }
            else {
              pEVar6 = _makeunreachable(this);
            }
          }
          else {
            pEVar6 = _makeConcrete(this,type_00);
          }
          cVar4 = wasm::Type::isSubType((Type)(pEVar6->type).id,type_00);
          if (cVar4 != '\0') {
            this->nesting = this->nesting + -1;
            return pEVar6;
          }
          Fatal::Fatal((Fatal *)local_1b0);
          poVar1 = (ostream *)(local_1b0 + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,"Did not generate the right subtype of ",0x26);
          wasm::operator<<(poVar1,type_00);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,", instead we have ",0x12);
          wasm::operator<<(poVar1,(Type)(pEVar6->type).id);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," : ",3);
          std::operator<<(poVar1,pEVar6);
          local_21 = '\n';
          Fatal::operator<<((Fatal *)local_1b0,&local_21);
          Fatal::~Fatal((Fatal *)local_1b0);
        }
        uVar5 = Random::upTo(this_00,3);
        if (uVar5 == 0) goto LAB_001297d6;
      }
    }
    if (1 < type_00.id) {
      uVar5 = Random::upTo(this_00,2);
      if (uVar5 != 0) {
        pEVar6 = makeLocalGet(this,type_00);
        return pEVar6;
      }
      pEVar6 = makeConst(this,type_00);
      return pEVar6;
    }
    if ((type_00.id & 1) == 0) {
      uVar5 = Random::upTo(this_00,2);
      if (uVar5 != 0) {
        pEVar6 = makeLocalSet(this,type_00);
        return pEVar6;
      }
      pEVar6 = makeNop(this,type_00);
      return pEVar6;
    }
  }
  pEVar6 = makeTrivial(this,type_00);
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::make(Type type) {
  type = getSubType(type);
  if (trivialNesting) {
    // We are nested under a makeTrivial call, so only emit something trivial.
    return makeTrivial(type);
  }
  // When we should stop, emit something small (but not necessarily trivial).
  if (random.finished() ||
      nesting >= 5 * fuzzParams->NESTING_LIMIT || // hard limit
      (nesting >= fuzzParams->NESTING_LIMIT && !oneIn(3))) {
    if (type.isConcrete()) {
      if (oneIn(2)) {
        return makeConst(type);
      } else {
        return makeLocalGet(type);
      }
    } else if (type == Type::none) {
      if (oneIn(2)) {
        return makeNop(type);
      } else {
        return makeLocalSet(type);
      }
    }
    assert(type == Type::unreachable);
    return makeTrivial(type);
  }
  nesting++;
  Expression* ret = nullptr;
  if (type.isConcrete()) {
    ret = _makeConcrete(type);
  } else if (type == Type::none) {
    ret = _makenone();
  } else {
    assert(type == Type::unreachable);
    ret = _makeunreachable();
  }
  if (!Type::isSubType(ret->type, type)) {
    Fatal() << "Did not generate the right subtype of " << type
            << ", instead we have " << ret->type << " : " << *ret << '\n';
  }
  nesting--;
  return ret;
}